

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O3

void clear_memory(TRIPLEYCbCr **mrx,int h)

{
  ulong uVar1;
  
  if (h < 1) {
    if (mrx == (TRIPLEYCbCr **)0x0) {
      return;
    }
  }
  else {
    uVar1 = 0;
    do {
      if (mrx[uVar1] != (TRIPLEYCbCr *)0x0) {
        operator_delete__(mrx[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)h != uVar1);
  }
  operator_delete__(mrx);
  return;
}

Assistant:

void clear_memory(TRIPLEYCbCr **mrx, int h) {
    for (int i = 0; i < h; i++)
        delete[] mrx[i];
    delete[] mrx;
}